

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scoped_ptr.h
# Opt level: O1

void __thiscall
MeCab::scoped_ptr<MeCab::DictionaryRewriter>::reset
          (scoped_ptr<MeCab::DictionaryRewriter> *this,DictionaryRewriter *p)

{
  DictionaryRewriter *this_00;
  
  this_00 = this->ptr_;
  if (this_00 != (DictionaryRewriter *)0x0) {
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::FeatureSet>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::FeatureSet>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MeCab::FeatureSet>_>_>
    ::~_Rb_tree(&(this_00->cache_)._M_t);
    std::vector<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>::~vector
              (&(this_00->right_rewrite_).
                super_vector<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>);
    std::vector<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>::~vector
              (&(this_00->left_rewrite_).
                super_vector<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>);
    std::vector<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_>::~vector
              ((vector<MeCab::RewritePattern,_std::allocator<MeCab::RewritePattern>_> *)this_00);
    operator_delete(this_00);
  }
  this->ptr_ = p;
  return;
}

Assistant:

void reset(T * p = 0) {
    delete ptr_;
    ptr_ = p;
  }